

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpMeshHandler.c
# Opt level: O1

void sbfTcpMeshHandlerConnectionTimerCb(int fd,short events,void *closure)

{
  int iVar1;
  timeval tv;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_18 = 3;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  sbfLog_log(**closure,1,"trying connection %p to %s:%hu",closure,
             *(undefined8 *)((long)closure + 0x90),*(undefined2 *)((long)closure + 0x98));
  sbfTcpMeshHandlerCloseSocket((sbfTcpMeshHandlerConnection)closure);
  iVar1 = socket(2,1,6);
  if (-1 < iVar1) {
    sbfTcpMeshHandlerSetSocket((sbfTcpMeshHandlerConnection)closure,iVar1);
    iVar1 = bufferevent_socket_connect_hostname
                      (*(undefined8 *)((long)closure + 0xa0),0,2,
                       *(undefined8 *)((long)closure + 0x90),*(undefined2 *)((long)closure + 0x98));
    if (iVar1 == 0) {
      return;
    }
  }
  sbfLog_log(**closure,1,"connection %p failed",closure);
  event_add((long)closure + 8,&local_18);
  return;
}

Assistant:

static void
sbfTcpMeshHandlerConnectionTimerCb (int fd, short events, void* closure)
{
    sbfTcpMeshHandlerConnection c = closure;
    int                         error;
    struct timeval              tv = SBF_TCP_MESH_HANDLER_CONNECT_INTERVAL;
    evutil_socket_t             s;

    sbfLog_info (c->mParent->mLog,
                 "trying connection %p to %s:%hu",
                 c,
                 c->mHost,
                 c->mPort);

    sbfTcpMeshHandlerCloseSocket (c);

    s = socket (AF_INET, SOCK_STREAM, IPPROTO_TCP);
    if (s < 0)
        goto fail;
    sbfTcpMeshHandlerSetSocket (c, s);

    error = bufferevent_socket_connect_hostname (c->mEvent,
                                                 NULL,
                                                 AF_INET,
                                                 c->mHost,
                                                 c->mPort);
    if (error != 0)
        goto fail;

    return;

fail:
    sbfLog_info (c->mParent->mLog, "connection %p failed", c);
    event_add (&c->mTimer, &tv);
}